

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

void coupon_sample(int type_num,int *seed,int *coupon,int *box_num)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (0 < type_num) {
    memset(coupon,0,(ulong)(uint)type_num << 2);
  }
  *box_num = 0;
  iVar3 = 0;
  do {
    iVar1 = i4_uniform_ab(1,type_num,seed);
    coupon[(long)iVar1 + -1] = coupon[(long)iVar1 + -1] + 1;
    *box_num = *box_num + 1;
    if (iVar1 == iVar3 + 1) {
      lVar2 = (long)iVar3;
      do {
        lVar2 = lVar2 + 1;
        if (type_num <= lVar2) {
          return;
        }
        iVar3 = iVar3 + 1;
      } while (0 < coupon[lVar2]);
    }
  } while (*box_num < 2000);
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"COUPON_SAMPLE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Maximum number of coupons drawn without success.\n");
  exit(1);
}

Assistant:

void coupon_sample ( int type_num, int &seed, int coupon[], int *box_num )

//****************************************************************************80
//
//  Purpose:
//
//    COUPON_SAMPLE simulates the coupon collector's problem.
//
//  Discussion:
//
//    The coupon collector needs to collect one of each of TYPE_NUM
//    coupons.  The collector may draw one coupon (or, in some settings,
//    open one box) on each trial, and takes as many trials as necessary
//    to complete the task.  On each trial, the probability of picking
//    any particular type of coupon is always 1 / TYPE_NUM.
//
//    Interesting questions include;
//
//    * what is the expected number of drawings necessary to complete
//      the collection?
//
//    * How does the expected number of drawings necessary to complete
//      the collection vary as TYPE_NUM increases?
//
//    * What is the distribution of the numbers of each type of coupon
//      in a typical collection when it is just completed?
//
//    As TYPE_NUM increases, the number of coupons necessary to be
//    collected in order to get a complete set in any simulation
//    strongly tends to the value TYPE_NUM * LOG ( TYPE_NUM ).
//
//    If TYPE_NUM is 1, the simulation ends with a single drawing.
//
//    If TYPE_NUM is 2, then we may call the coupon taken on the first drawing
//    a "Head", say, and the process then is similar to the question of the
//    length, plus one, of a run of Heads or Tails in coin flipping.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int TYPE_NUM, the number of types of coupons.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int COUPON[TYPE_NUM], the number of coupons of each type
//    that were collected during the simulation.
//
//    Output, int *BOX_NUM, the total number of boxes opened.
//
{
  int i;
  int box_max = 2000;
  int straight;

  for ( i = 0; i < type_num; i++ )
  {
    coupon[i] = 0;
  }

  straight = 0;
  *box_num = 0;
//
//  Draw another coupon.
//
  while ( *box_num < box_max )
  {
    i = i4_uniform_ab ( 1, type_num, seed );
//
//  Increment the number of I coupons.
//
    coupon[i-1] = coupon[i-1] + 1;
    *box_num = *box_num + 1;
//
//  If I is the next one we needed, increase STRAIGHT by 1.
//
    if ( i == straight + 1 )
    {
      for ( ; ; )
      {
        straight = straight + 1;
//
//  If STRAIGHT = TYPE_NUM, we have all of them.
//
        if ( type_num <= straight )
        {
          return;
        }
//
//  If the next coupon has not been collected, our straight is over.
//
        if ( coupon[straight] <= 0 )
        {
          break;
        }
      }
    }
  }

  cerr << " \n";
  cerr << "COUPON_SAMPLE - Fatal error!\n";
  cerr << "  Maximum number of coupons drawn without success.\n";

  exit ( 1 );
}